

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
GraphContigger::end_to_end_solution
          (GraphContigger *this,vector<long,_std::allocator<long>_> *p,
          vector<long,_std::allocator<long>_> *fnids)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<long,_std::allocator<long>_> *in_RDX;
  undefined8 *in_RSI;
  vector<long,_std::allocator<long>_> *in_RDI;
  set<long,_std::less<long>,_std::allocator<long>_> fw_skipped;
  long *skipped;
  iterator __end8;
  iterator __begin8;
  set<long,_std::less<long>,_std::allocator<long>_> *__range8;
  vector<long,_std::allocator<long>_> a;
  set<long,_std::less<long>,_std::allocator<long>_> fw_reached_nodes_2;
  set<long,_std::less<long>,_std::allocator<long>_> fw_reached_nodes_1;
  value_type n;
  int x_2;
  vector<long,_std::allocator<long>_> csol;
  int x_1;
  int x;
  vector<long,_std::allocator<long>_> sol;
  int j;
  int i;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_fffffffffffffd08;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffd10;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffd18;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffd20;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffd28;
  _Self local_248;
  _Base_ptr local_240;
  _Base_ptr local_238;
  _Self local_230;
  vector<long,_std::allocator<long>_> local_228 [2];
  reference local_1f8;
  uint local_1ec;
  _Self local_1e8;
  _Self local_1e0;
  undefined1 local_1d8 [48];
  undefined1 *local_1a8;
  int in_stack_fffffffffffffe6c;
  pointer in_stack_fffffffffffffe70;
  iterator in_stack_fffffffffffffe78;
  _Self local_170;
  _Self local_168;
  _Base_ptr local_160;
  _Base_ptr local_158;
  _Self local_150;
  _Rb_tree_node_base local_148 [3];
  value_type local_e8;
  int local_dc;
  long *local_c0;
  long *local_b8;
  long local_b0;
  int local_a4;
  int local_a0;
  vector<long,_std::allocator<long>_> local_90;
  long *local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  int local_54;
  long *local_50;
  long local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    uVar4 = (ulong)local_24;
    sVar5 = std::vector<long,_std::allocator<long>_>::size(in_RDX);
    if (sVar5 <= uVar4) {
      memset(in_RDI,0,0x18);
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)0x4c16b3);
      return in_RDI;
    }
    local_38 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
    local_40 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_24);
    local_48 = -*pvVar6;
    local_30 = (long *)std::
                       find<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                                 (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                                  in_stack_fffffffffffffd18._M_current);
    local_50 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       in_stack_fffffffffffffd10,
                       (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       in_stack_fffffffffffffd08);
    local_54 = local_24;
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  do {
    local_54 = local_54 + 1;
    uVar4 = (ulong)local_54;
    sVar5 = std::vector<long,_std::allocator<long>_>::size(in_RDX);
    if (sVar5 <= uVar4) {
      memset(in_RDI,0,0x18);
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)0x4c1678);
      return in_RDI;
    }
    local_68 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
    local_70 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
    std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_54);
    local_60 = (long *)std::
                       find<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                                 (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                                  in_stack_fffffffffffffd18._M_current);
    local_78 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       in_stack_fffffffffffffd10,
                       (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       in_stack_fffffffffffffd08);
  } while (!bVar1);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x4c0e58);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_24);
  iVar2 = std::abs((int)*pvVar6);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_54);
  iVar3 = std::abs((int)*pvVar6);
  if (CONCAT44(extraout_var,iVar2) < CONCAT44(extraout_var_00,iVar3)) {
    for (local_a0 = local_24; local_a0 < local_54 + 1; local_a0 = local_a0 + 1) {
      std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_a0);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd20._M_current,
                 in_stack_fffffffffffffd18._M_current);
    }
  }
  else {
    for (local_a4 = local_24; local_a4 < local_54 + 1; local_a4 = local_a4 + 1) {
      pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_a4);
      local_b0 = -*pvVar6;
      std::vector<long,_std::allocator<long>_>::push_back
                (in_stack_fffffffffffffd10,(value_type *)in_stack_fffffffffffffd08);
    }
    local_b8 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
    local_c0 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
    std::reverse<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x4c0ff5);
  std::vector<long,_std::allocator<long>_>::operator[](&local_90,0);
  std::vector<long,_std::allocator<long>_>::push_back
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd20._M_current,
             in_stack_fffffffffffffd18._M_current);
  local_dc = 1;
  while (uVar4 = (ulong)local_24, sVar5 = std::vector<long,_std::allocator<long>_>::size(&local_90),
        uVar4 < sVar5) {
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&local_90,(long)local_dc);
    local_e8 = *pvVar6;
    std::vector<long,_std::allocator<long>_>::back(in_stack_fffffffffffffd10);
    DistanceGraph::fw_reached_nodes
              ((DistanceGraph *)in_stack_fffffffffffffe78._M_node,
               (sgNodeID_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    std::vector<long,_std::allocator<long>_>::back(in_stack_fffffffffffffd10);
    DistanceGraph::fw_reached_nodes
              ((DistanceGraph *)in_stack_fffffffffffffe78._M_node,
               (sgNodeID_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_158 = (_Base_ptr)
                std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                          (in_stack_fffffffffffffd08);
    local_160 = (_Base_ptr)
                std::set<long,_std::less<long>,_std::allocator<long>_>::end
                          (in_stack_fffffffffffffd08);
    local_150._M_node =
         (_Base_ptr)
         std::find<std::_Rb_tree_const_iterator<long>,long>
                   ((_Rb_tree_const_iterator<long>)in_stack_fffffffffffffd28._M_current,
                    (_Rb_tree_const_iterator<long>)in_stack_fffffffffffffd20._M_current,
                    in_stack_fffffffffffffd18._M_current);
    local_168._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::end(in_stack_fffffffffffffd08);
    bVar1 = std::operator!=(&local_150,&local_168);
    if (bVar1) {
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd20._M_current,
                 in_stack_fffffffffffffd18._M_current);
LAB_004c157b:
      local_1ec = 0;
    }
    else {
      in_stack_fffffffffffffd28._M_current = (long *)local_148;
      std::set<long,_std::less<long>,_std::allocator<long>_>::begin(in_stack_fffffffffffffd08);
      std::set<long,_std::less<long>,_std::allocator<long>_>::end(in_stack_fffffffffffffd08);
      local_170._M_node =
           (_Base_ptr)
           std::find<std::_Rb_tree_const_iterator<long>,long>
                     ((_Rb_tree_const_iterator<long>)in_stack_fffffffffffffd28._M_current,
                      (_Rb_tree_const_iterator<long>)in_stack_fffffffffffffd20._M_current,
                      in_stack_fffffffffffffd18._M_current);
      in_stack_fffffffffffffe78 =
           std::set<long,_std::less<long>,_std::allocator<long>_>::end(in_stack_fffffffffffffd08);
      bVar1 = std::operator!=(&local_170,(_Self *)&stack0xfffffffffffffe78);
      if (bVar1) {
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)0x4c1271);
        in_stack_fffffffffffffd20._M_current = (long *)*in_RSI;
        std::vector<long,_std::allocator<long>_>::back(in_stack_fffffffffffffd10);
        DistanceGraph::fw_reached_nodes
                  ((DistanceGraph *)in_stack_fffffffffffffe78._M_node,
                   (sgNodeID_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        local_1a8 = local_1d8;
        local_1e0._M_node =
             (_Base_ptr)
             std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                       (in_stack_fffffffffffffd08);
        local_1e8._M_node =
             (_Base_ptr)
             std::set<long,_std::less<long>,_std::allocator<long>_>::end(in_stack_fffffffffffffd08);
        while (bVar1 = std::operator!=(&local_1e0,&local_1e8), bVar1) {
          local_1f8 = std::_Rb_tree_const_iterator<long>::operator*
                                ((_Rb_tree_const_iterator<long> *)0x4c1333);
          DistanceGraph::fw_reached_nodes
                    ((DistanceGraph *)in_stack_fffffffffffffe78._M_node,
                     (sgNodeID_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
          in_stack_fffffffffffffd10 = local_228;
          local_238 = (_Base_ptr)
                      std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                                (in_stack_fffffffffffffd08);
          local_240 = (_Base_ptr)
                      std::set<long,_std::less<long>,_std::allocator<long>_>::end
                                (in_stack_fffffffffffffd08);
          in_stack_fffffffffffffd18._M_current =
               (long *)std::find<std::_Rb_tree_const_iterator<long>,long>
                                 (in_stack_fffffffffffffd28._M_current,
                                  in_stack_fffffffffffffd20._M_current,
                                  in_stack_fffffffffffffd18._M_current);
          local_230._M_node = (_Base_ptr)in_stack_fffffffffffffd18._M_current;
          local_248._M_node =
               (_Base_ptr)
               std::set<long,_std::less<long>,_std::allocator<long>_>::end
                         (in_stack_fffffffffffffd08);
          bVar1 = std::operator!=(&local_230,&local_248);
          if (bVar1) {
            std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd20._M_current,
                       in_stack_fffffffffffffd18._M_current);
          }
          sVar5 = std::vector<long,_std::allocator<long>_>::size
                            ((vector<long,_std::allocator<long>_> *)&stack0xfffffffffffffe60);
          if (sVar5 != 1) {
            std::vector<long,_std::allocator<long>_>::vector
                      (in_stack_fffffffffffffd10,
                       (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
          }
          else {
            std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)&stack0xfffffffffffffe60,0);
            std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd20._M_current,
                       in_stack_fffffffffffffd18._M_current);
            std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd20._M_current,
                       in_stack_fffffffffffffd18._M_current);
          }
          local_1ec = (uint)(sVar5 != 1);
          std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)0x4c14d6);
          if (local_1ec != 0) goto LAB_004c14f7;
          std::_Rb_tree_const_iterator<long>::operator++
                    ((_Rb_tree_const_iterator<long> *)in_stack_fffffffffffffd10);
        }
        local_1ec = 0x11;
LAB_004c14f7:
        std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)0x4c1504);
        if (local_1ec == 0x11) {
          local_1ec = 0;
        }
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd20._M_current);
        if (local_1ec == 0) goto LAB_004c157b;
      }
      else {
        std::vector<long,_std::allocator<long>_>::vector
                  (in_stack_fffffffffffffd10,
                   (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
        local_1ec = 1;
      }
    }
    std::set<long,_std::less<long>,_std::allocator<long>_>::~set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)0x4c1593);
    std::set<long,_std::less<long>,_std::allocator<long>_>::~set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)0x4c15a0);
    if (local_1ec != 0) goto LAB_004c1601;
    local_dc = local_dc + 1;
  }
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffd10,
             (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd08);
  local_1ec = 1;
LAB_004c1601:
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd20._M_current);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd20._M_current);
  return in_RDI;
}

Assistant:

std::vector<sgNodeID_t> GraphContigger::end_to_end_solution(std::vector<sgNodeID_t> p, std::vector<sgNodeID_t> fnids){
    for (auto i=0; i<p.size(); ++i){
        if (std::find(fnids.begin(), fnids.end(), -p[i]) != fnids.end()) {
            for (auto j=i+1; j<p.size(); ++j) {
                if (std::find(fnids.begin(), fnids.end(), p[j])!=fnids.end()){
                    std::vector<sgNodeID_t> sol;
                    if (std::abs(p[i])<std::abs(p[j])){
                        for (auto x=i; x<j+1; ++x) sol.push_back(p[x]);
                    } else {
                        for (auto x=i; x<j+1; ++x) sol.push_back(-p[x]);
                        std::reverse(sol.begin(), sol.end());
                    }
                    std::vector<sgNodeID_t> csol;
                    csol.push_back(sol[0]);
                    for (auto x=1; i<sol.size(); ++x){
                        auto n=sol[x];
                        auto fw_reached_nodes_1 = ws.sdg.fw_reached_nodes(csol.back(),1);
                        auto fw_reached_nodes_2 = ws.sdg.fw_reached_nodes(csol.back(),2);
                        if (std::find(fw_reached_nodes_1.begin(), fw_reached_nodes_1.end(), n)!=fw_reached_nodes_1.end()) {
                            csol.push_back(n);
                        } else if (std::find(fw_reached_nodes_2.begin(), fw_reached_nodes_2.end(), n)!=fw_reached_nodes_2.end()) {
                            std::vector<sgNodeID_t> a;
                            for (const auto& skipped: ws.sdg.fw_reached_nodes(csol.back(),1)) {
                                auto fw_skipped = ws.sdg.fw_reached_nodes(skipped,1);
                                if (std::find(fw_skipped.begin(), fw_skipped.end(), n)!=fw_skipped.end()) a.push_back(skipped);
                                if (a.size()==1) {
                                    csol.push_back(a[0]);
                                    csol.push_back(n);
                                } else {
                                    return sol;
                                }
                            }
                        } else {
//                            for (auto &s: sol) {
//                                std::cout << s << ",";
//                            }
//                            std::cout << std::endl;
                            return sol;
                        }
                    }
                    return csol;
                }
            }
            return std::vector<sgNodeID_t>();
        }
    }
    return std::vector<sgNodeID_t>();
}